

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O0

int testRobustEncoding(void)

{
  undefined8 uVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  ostream *poVar8;
  wchar_t *extraout_RDX;
  wchar_t *extraout_RDX_00;
  wchar_t *extraout_RDX_01;
  wchar_t *extraout_RDX_02;
  wchar_t *pwVar9;
  string local_f0;
  undefined1 local_d0 [8];
  string str;
  size_t i_1;
  wchar_t *wcstr_1;
  ulong local_80;
  size_t i;
  wchar_t *wcstr;
  Encoding local_60 [32];
  Encoding local_40 [8];
  wstring wstr;
  char local_1a [2];
  int local_18;
  fmtflags fStack_14;
  char cstr [2];
  int ret;
  fmtflags *flags;
  
  fStack_14 = std::ios_base::flags((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  local_18 = 0;
  local_1a[0] = -1;
  local_1a[1] = '\0';
  cmsys::Encoding::ToWide_abi_cxx11_(local_40,local_1a);
  cmsys::Encoding::ToWide_abi_cxx11_(local_60,(char *)0x0);
  std::__cxx11::wstring::operator=((wstring *)local_40,(wstring *)local_60);
  std::__cxx11::wstring::~wstring((wstring *)local_60);
  bVar3 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_40,L"");
  if (bVar3) {
    i = std::__cxx11::wstring::c_str();
    std::operator<<((ostream *)&std::cout,"ToWide(NULL) returned");
    for (local_80 = 0; uVar6 = local_80, uVar4 = std::__cxx11::wstring::size(), uVar6 < uVar4;
        local_80 = local_80 + 1) {
      poVar8 = std::operator<<((ostream *)&std::cout," ");
      pvVar7 = (void *)std::ostream::operator<<(poVar8,std::hex);
      std::ostream::operator<<(pvVar7,*(int *)(i + local_80 * 4));
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
  }
  cmsys::Encoding::ToWide_abi_cxx11_((Encoding *)&wcstr_1,"");
  std::__cxx11::wstring::operator=((wstring *)local_40,(wstring *)&wcstr_1);
  std::__cxx11::wstring::~wstring((wstring *)&wcstr_1);
  bVar3 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_40,L"");
  pwVar9 = extraout_RDX;
  if (bVar3) {
    lVar5 = std::__cxx11::wstring::c_str();
    std::operator<<((ostream *)&std::cout,"ToWide(\"\") returned");
    for (str.field_2._8_8_ = 0; uVar1 = str.field_2._8_8_, uVar6 = std::__cxx11::wstring::size(),
        (ulong)uVar1 < uVar6; str.field_2._8_8_ = str.field_2._8_8_ + 1) {
      poVar8 = std::operator<<((ostream *)&std::cout," ");
      pvVar7 = (void *)std::ostream::operator<<(poVar8,std::hex);
      std::ostream::operator<<(pvVar7,*(int *)(lVar5 + str.field_2._8_8_ * 4));
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
    pwVar9 = extraout_RDX_00;
  }
  cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_d0,(Encoding *)0x0,pwVar9);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d0,"");
  pwVar9 = extraout_RDX_01;
  if (bVar3) {
    poVar8 = std::operator<<((ostream *)&std::cout,"ToNarrow(NULL) returned ");
    poVar8 = std::operator<<(poVar8,(string *)local_d0);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
    pwVar9 = extraout_RDX_02;
  }
  cmsys::Encoding::ToNarrow_abi_cxx11_(&local_f0,(Encoding *)L"",pwVar9);
  std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  bVar3 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_40,L"");
  if (bVar3) {
    poVar8 = std::operator<<((ostream *)&std::cout,"ToNarrow(\"\") returned ");
    poVar8 = std::operator<<(poVar8,(string *)local_d0);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
  }
  std::ios_base::flags((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),fStack_14);
  iVar2 = local_18;
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::wstring::~wstring((wstring *)local_40);
  return iVar2;
}

Assistant:

static int testRobustEncoding()
{
  // test that the conversion functions handle invalid
  // unicode correctly/gracefully

  // we manipulate the format flags of stdout, remember
  // the original state here to restore before return
  std::ios::fmtflags const& flags = std::cout.flags();

  int ret = 0;
  char cstr[] = { (char)-1, 0 };
  // this conversion could fail
  std::wstring wstr = kwsys::Encoding::ToWide(cstr);

  wstr = kwsys::Encoding::ToWide(KWSYS_NULLPTR);
  if (wstr != L"") {
    const wchar_t* wcstr = wstr.c_str();
    std::cout << "ToWide(NULL) returned";
    for (size_t i = 0; i < wstr.size(); i++) {
      std::cout << " " << std::hex << (int)wcstr[i];
    }
    std::cout << std::endl;
    ret++;
  }
  wstr = kwsys::Encoding::ToWide("");
  if (wstr != L"") {
    const wchar_t* wcstr = wstr.c_str();
    std::cout << "ToWide(\"\") returned";
    for (size_t i = 0; i < wstr.size(); i++) {
      std::cout << " " << std::hex << (int)wcstr[i];
    }
    std::cout << std::endl;
    ret++;
  }

#ifdef _WIN32
  // 16 bit wchar_t - we make an invalid surrogate pair
  wchar_t cwstr[] = { 0xD801, 0xDA00, 0 };
  // this conversion could fail
  std::string win_str = kwsys::Encoding::ToNarrow(cwstr);
#endif

  std::string str = kwsys::Encoding::ToNarrow(KWSYS_NULLPTR);
  if (str != "") {
    std::cout << "ToNarrow(NULL) returned " << str << std::endl;
    ret++;
  }

  str = kwsys::Encoding::ToNarrow(L"");
  if (wstr != L"") {
    std::cout << "ToNarrow(\"\") returned " << str << std::endl;
    ret++;
  }

  std::cout.flags(flags);
  return ret;
}